

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_longnames.cpp
# Opt level: O2

LongNameHandler *
icu_63::number::impl::LongNameHandler::forCompoundUnit
          (Locale *loc,MeasureUnit *unit,MeasureUnit *perUnit,UNumberUnitWidth *width,
          PluralRules *rules,MicroPropsGenerator *parent,UErrorCode *status)

{
  UErrorCode UVar1;
  LongNameHandler *this;
  long lVar2;
  UChar *text;
  UnicodeString *pUVar3;
  int32_t local_654;
  MeasureUnit *local_650;
  SimpleFormatter compiled;
  LocalUResourceBundlePointer unitsBundle;
  UnicodeString rawPerUnitFormat;
  UnicodeString secondaryFormat;
  SimpleFormatter secondaryCompiled;
  UnicodeString secondaryString;
  UnicodeString perUnitFormat;
  UnicodeString local_478;
  UnicodeString local_438 [7];
  UnicodeString local_278;
  UnicodeString local_238 [8];
  
  local_650 = perUnit;
  this = (LongNameHandler *)UMemory::operator_new((UMemory *)0x2c0,(size_t)unit);
  if (this == (LongNameHandler *)0x0) {
    *status = U_MEMORY_ALLOCATION_ERROR;
    return (LongNameHandler *)0x0;
  }
  LongNameHandler(this,rules,parent);
  lVar2 = 0;
  do {
    *(undefined ***)((long)&local_238[0].super_Replaceable.super_UObject._vptr_UObject + lVar2) =
         &PTR__UnicodeString_00471e80;
    *(undefined2 *)((long)&local_238[0].fUnion + lVar2) = 2;
    lVar2 = lVar2 + 0x40;
  } while (lVar2 != 0x200);
  anon_unknown.dwarf_19f4f6::getMeasureData(loc,unit,width,local_238,status);
  if (U_ZERO_ERROR < *status) goto LAB_0029a877;
  lVar2 = 0;
  do {
    *(undefined ***)((long)&local_438[0].super_Replaceable.super_UObject._vptr_UObject + lVar2) =
         &PTR__UnicodeString_00471e80;
    *(undefined2 *)((long)&local_438[0].fUnion + lVar2) = 2;
    lVar2 = lVar2 + 0x40;
  } while (lVar2 != 0x200);
  anon_unknown.dwarf_19f4f6::getMeasureData(loc,local_650,width,local_438,status);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    perUnitFormat.super_Replaceable.super_UObject._vptr_UObject =
         (UObject)&PTR__UnicodeString_00471e80;
    perUnitFormat.fUnion.fStackFields.fLengthAndFlags = 2;
    if ((local_278.fUnion.fStackFields.fLengthAndFlags._0_1_ & 1) == 0) {
      icu_63::UnicodeString::operator=(&perUnitFormat,&local_278);
LAB_0029a61a:
      icu_63::UnicodeString::UnicodeString(&local_478,&perUnitFormat);
      multiSimpleFormatsToModifiers(this,local_238,&local_478,UNUM_FIELD_COUNT,status);
      pUVar3 = &local_478;
LAB_0029a846:
      icu_63::UnicodeString::~UnicodeString(pUVar3);
    }
    else {
      unitsBundle.super_LocalPointerBase<UResourceBundle>.ptr =
           (LocalPointerBase<UResourceBundle>)ures_open_63("icudt63l-unit",loc->fullName,status);
      if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
        MaybeStackArray<char,_40>::MaybeStackArray((MaybeStackArray<char,_40> *)&compiled);
        compiled.compiledPattern.fUnion._40_4_ = 0;
        *(undefined1 *)compiled._0_8_ = 0;
        StringPiece::StringPiece((StringPiece *)&secondaryCompiled,"units");
        CharString::append((CharString *)&compiled,(char *)secondaryCompiled._0_8_,
                           (int32_t)secondaryCompiled.compiledPattern.super_Replaceable.
                                    super_UObject._vptr_UObject,status);
        if (*width == UNUM_UNIT_WIDTH_SHORT) {
          StringPiece::StringPiece((StringPiece *)&secondaryFormat,"Short");
LAB_0029a722:
          CharString::append((CharString *)&compiled,
                             (char *)secondaryFormat.super_Replaceable.super_UObject._vptr_UObject,
                             secondaryFormat.fUnion._0_4_,status);
        }
        else if (*width == UNUM_UNIT_WIDTH_NARROW) {
          StringPiece::StringPiece((StringPiece *)&secondaryFormat,"Narrow");
          goto LAB_0029a722;
        }
        StringPiece::StringPiece((StringPiece *)&secondaryString,"/compound/per");
        CharString::append((CharString *)&compiled,
                           (char *)secondaryString.super_Replaceable.super_UObject._vptr_UObject,
                           secondaryString.fUnion._0_4_,status);
        local_654 = 0;
        text = ures_getStringByKeyWithFallback_63
                         ((UResourceBundle *)unitsBundle.super_LocalPointerBase<UResourceBundle>.ptr
                          ,(char *)compiled._0_8_,&local_654,status);
        icu_63::UnicodeString::UnicodeString(&rawPerUnitFormat,text,local_654);
        MaybeStackArray<char,_40>::~MaybeStackArray((MaybeStackArray<char,_40> *)&compiled);
      }
      else {
        rawPerUnitFormat.super_Replaceable.super_UObject._vptr_UObject =
             (UObject)&PTR__UnicodeString_00471e80;
        rawPerUnitFormat.fUnion.fStackFields.fLengthAndFlags = 2;
      }
      LocalUResourceBundlePointer::~LocalUResourceBundlePointer(&unitsBundle);
      if (U_ZERO_ERROR < *status) {
LAB_0029a83e:
        pUVar3 = &rawPerUnitFormat;
        goto LAB_0029a846;
      }
      SimpleFormatter::SimpleFormatter(&compiled,&rawPerUnitFormat,2,2,status);
      if (U_ZERO_ERROR < *status) {
LAB_0029a834:
        SimpleFormatter::~SimpleFormatter(&compiled);
        goto LAB_0029a83e;
      }
      anon_unknown.dwarf_19f4f6::getWithPlural(&secondaryFormat,local_438,ONE,status);
      if (U_ZERO_ERROR < *status) {
LAB_0029a827:
        icu_63::UnicodeString::~UnicodeString(&secondaryFormat);
        goto LAB_0029a834;
      }
      SimpleFormatter::SimpleFormatter(&secondaryCompiled,&secondaryFormat,1,1,status);
      if (U_ZERO_ERROR < *status) {
        SimpleFormatter::~SimpleFormatter(&secondaryCompiled);
        goto LAB_0029a827;
      }
      SimpleFormatter::getTextWithNoArguments((UnicodeString *)&unitsBundle,&secondaryCompiled);
      pUVar3 = icu_63::UnicodeString::trim((UnicodeString *)&unitsBundle);
      icu_63::UnicodeString::UnicodeString(&secondaryString,pUVar3);
      icu_63::UnicodeString::~UnicodeString((UnicodeString *)&unitsBundle);
      icu_63::UnicodeString::UnicodeString((UnicodeString *)&unitsBundle,L"{0}");
      SimpleFormatter::format
                (&compiled,(UnicodeString *)&unitsBundle,&secondaryString,&perUnitFormat,status);
      icu_63::UnicodeString::~UnicodeString((UnicodeString *)&unitsBundle);
      UVar1 = *status;
      icu_63::UnicodeString::~UnicodeString(&secondaryString);
      SimpleFormatter::~SimpleFormatter(&secondaryCompiled);
      icu_63::UnicodeString::~UnicodeString(&secondaryFormat);
      SimpleFormatter::~SimpleFormatter(&compiled);
      icu_63::UnicodeString::~UnicodeString(&rawPerUnitFormat);
      if (UVar1 < U_ILLEGAL_ARGUMENT_ERROR) goto LAB_0029a61a;
    }
    icu_63::UnicodeString::~UnicodeString(&perUnitFormat);
  }
  lVar2 = 0x1c0;
  do {
    icu_63::UnicodeString::~UnicodeString
              ((UnicodeString *)
               ((long)&local_438[0].super_Replaceable.super_UObject._vptr_UObject + lVar2));
    lVar2 = lVar2 + -0x40;
  } while (lVar2 != -0x40);
LAB_0029a877:
  lVar2 = 0x1c0;
  do {
    icu_63::UnicodeString::~UnicodeString
              ((UnicodeString *)
               ((long)&local_238[0].super_Replaceable.super_UObject._vptr_UObject + lVar2));
    lVar2 = lVar2 + -0x40;
  } while (lVar2 != -0x40);
  return this;
}

Assistant:

LongNameHandler*
LongNameHandler::forCompoundUnit(const Locale &loc, const MeasureUnit &unit, const MeasureUnit &perUnit,
                                 const UNumberUnitWidth &width, const PluralRules *rules,
                                 const MicroPropsGenerator *parent, UErrorCode &status) {
    auto* result = new LongNameHandler(rules, parent);
    if (result == nullptr) {
        status = U_MEMORY_ALLOCATION_ERROR;
        return nullptr;
    }
    UnicodeString primaryData[ARRAY_LENGTH];
    getMeasureData(loc, unit, width, primaryData, status);
    if (U_FAILURE(status)) { return result; }
    UnicodeString secondaryData[ARRAY_LENGTH];
    getMeasureData(loc, perUnit, width, secondaryData, status);
    if (U_FAILURE(status)) { return result; }

    UnicodeString perUnitFormat;
    if (!secondaryData[PER_INDEX].isBogus()) {
        perUnitFormat = secondaryData[PER_INDEX];
    } else {
        UnicodeString rawPerUnitFormat = getPerUnitFormat(loc, width, status);
        if (U_FAILURE(status)) { return result; }
        // rawPerUnitFormat is something like "{0}/{1}"; we need to substitute in the secondary unit.
        SimpleFormatter compiled(rawPerUnitFormat, 2, 2, status);
        if (U_FAILURE(status)) { return result; }
        UnicodeString secondaryFormat = getWithPlural(secondaryData, StandardPlural::Form::ONE, status);
        if (U_FAILURE(status)) { return result; }
        SimpleFormatter secondaryCompiled(secondaryFormat, 1, 1, status);
        if (U_FAILURE(status)) { return result; }
        UnicodeString secondaryString = secondaryCompiled.getTextWithNoArguments().trim();
        // TODO: Why does UnicodeString need to be explicit in the following line?
        compiled.format(UnicodeString(u"{0}"), secondaryString, perUnitFormat, status);
        if (U_FAILURE(status)) { return result; }
    }
    // TODO: What field to use for units?
    result->multiSimpleFormatsToModifiers(primaryData, perUnitFormat, UNUM_FIELD_COUNT, status);
    return result;
}